

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddIsop.c
# Opt level: O3

DdNode * cuddMakeBddFromZddCover(DdManager *dd,DdNode *node)

{
  int iVar1;
  DdNode *pDVar2;
  DdNode *n;
  DdNode *pDVar3;
  DdNode *pDVar4;
  int iVar5;
  DdNode *fd;
  DdNode *f0;
  DdNode *f1;
  DdNode *local_58;
  DdNode *local_50;
  DdNode *local_48;
  DdNode *local_40;
  DdNode *local_38;
  
  pDVar2 = dd->one;
  if (pDVar2 == node) {
    return pDVar2;
  }
  if (dd->zero == node) {
    return (DdNode *)((ulong)pDVar2 ^ 1);
  }
  pDVar2 = cuddCacheLookup1(dd,cuddMakeBddFromZddCover,node);
  if (pDVar2 != (DdNode *)0x0) {
    return pDVar2;
  }
  iVar5 = *(int *)((ulong)node & 0xfffffffffffffffe);
  iVar1 = cuddZddGetCofactors3(dd,node,iVar5,&local_48,&local_50,&local_58);
  if (iVar1 != 0) {
    return (DdNode *)0x0;
  }
  Cudd_Ref(local_48);
  Cudd_Ref(local_50);
  Cudd_Ref(local_58);
  pDVar2 = cuddMakeBddFromZddCover(dd,local_48);
  if (pDVar2 == (DdNode *)0x0) {
    Cudd_RecursiveDerefZdd(dd,local_48);
    Cudd_RecursiveDerefZdd(dd,local_50);
    Cudd_RecursiveDerefZdd(dd,local_58);
    return (DdNode *)0x0;
  }
  Cudd_Ref(pDVar2);
  n = cuddMakeBddFromZddCover(dd,local_50);
  if (n == (DdNode *)0x0) {
    Cudd_RecursiveDerefZdd(dd,local_48);
    Cudd_RecursiveDerefZdd(dd,local_50);
    Cudd_RecursiveDerefZdd(dd,local_58);
    goto LAB_00808e5a;
  }
  Cudd_Ref(n);
  Cudd_RecursiveDerefZdd(dd,local_48);
  Cudd_RecursiveDerefZdd(dd,local_50);
  if (local_58 == dd->zero) {
    Cudd_RecursiveDerefZdd(dd,local_58);
LAB_00808d75:
    iVar5 = iVar5 / 2;
    if (((ulong)pDVar2 & 1) == 0) {
      pDVar3 = cuddUniqueInterIVO(dd,iVar5,pDVar2,n);
      if (pDVar3 != (DdNode *)0x0) {
LAB_00808dbe:
        Cudd_Ref(pDVar3);
        Cudd_RecursiveDeref(dd,pDVar2);
        Cudd_RecursiveDeref(dd,n);
        cuddCacheInsert1(dd,cuddMakeBddFromZddCover,node,pDVar3);
        Cudd_Deref(pDVar3);
        return pDVar3;
      }
    }
    else {
      pDVar3 = cuddUniqueInterIVO(dd,iVar5,(DdNode *)((ulong)pDVar2 & 0xfffffffffffffffe),
                                  (DdNode *)((ulong)n ^ 1));
      if (pDVar3 != (DdNode *)0x0) {
        pDVar3 = (DdNode *)((ulong)pDVar3 ^ 1);
        goto LAB_00808dbe;
      }
    }
  }
  else {
    pDVar3 = cuddMakeBddFromZddCover(dd,local_58);
    if (pDVar3 != (DdNode *)0x0) {
      Cudd_Ref(pDVar3);
      Cudd_RecursiveDerefZdd(dd,local_58);
      local_40 = pDVar3;
      pDVar4 = cuddBddAndRecur(dd,(DdNode *)((ulong)pDVar2 ^ 1),(DdNode *)((ulong)pDVar3 ^ 1));
      if (pDVar4 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,pDVar2);
        Cudd_RecursiveDeref(dd,n);
        pDVar2 = local_40;
        goto LAB_00808e5a;
      }
      local_38 = (DdNode *)((ulong)pDVar4 ^ 1);
      Cudd_Ref(local_38);
      Cudd_RecursiveDeref(dd,pDVar2);
      pDVar3 = cuddBddAndRecur(dd,(DdNode *)((ulong)n ^ 1),(DdNode *)((ulong)pDVar3 ^ 1));
      if (pDVar3 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,n);
        Cudd_RecursiveDeref(dd,local_40);
        pDVar2 = local_38;
        goto LAB_00808e5a;
      }
      Cudd_Ref((DdNode *)((ulong)pDVar3 ^ 1));
      Cudd_RecursiveDeref(dd,n);
      Cudd_RecursiveDeref(dd,local_40);
      pDVar2 = local_38;
      n = (DdNode *)((ulong)pDVar3 ^ 1);
      goto LAB_00808d75;
    }
    Cudd_RecursiveDerefZdd(dd,local_58);
  }
  Cudd_RecursiveDeref(dd,pDVar2);
  pDVar2 = n;
LAB_00808e5a:
  Cudd_RecursiveDeref(dd,pDVar2);
  return (DdNode *)0x0;
}

Assistant:

DdNode  *
cuddMakeBddFromZddCover(
  DdManager * dd,
  DdNode * node)
{
    DdNode      *neW;
    int         v;
    DdNode      *f1, *f0, *fd;
    DdNode      *b1, *b0, *bd;
    DdNode      *T, *E;

    statLine(dd);
    if (node == dd->one)
        return(dd->one);
    if (node == dd->zero)
        return(Cudd_Not(dd->one));

    /* Check cache */
    neW = cuddCacheLookup1(dd, cuddMakeBddFromZddCover, node);
    if (neW)
        return(neW);

    v = Cudd_Regular(node)->index;      /* either yi or zi */
    if (cuddZddGetCofactors3(dd, node, v, &f1, &f0, &fd)) return(NULL);
    Cudd_Ref(f1);
    Cudd_Ref(f0);
    Cudd_Ref(fd);

    b1 = cuddMakeBddFromZddCover(dd, f1);
    if (!b1) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, fd);
        return(NULL);
    }
    Cudd_Ref(b1);
    b0 = cuddMakeBddFromZddCover(dd, f0);
    if (!b0) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDeref(dd, b1);
        return(NULL);
    }
    Cudd_Ref(b0);
    Cudd_RecursiveDerefZdd(dd, f1);
    Cudd_RecursiveDerefZdd(dd, f0);
    if (fd != dd->zero) {
        bd = cuddMakeBddFromZddCover(dd, fd);
        if (!bd) {
            Cudd_RecursiveDerefZdd(dd, fd);
            Cudd_RecursiveDeref(dd, b1);
            Cudd_RecursiveDeref(dd, b0);
            return(NULL);
        }
        Cudd_Ref(bd);
        Cudd_RecursiveDerefZdd(dd, fd);

        T = cuddBddAndRecur(dd, Cudd_Not(b1), Cudd_Not(bd));
        if (!T) {
            Cudd_RecursiveDeref(dd, b1);
            Cudd_RecursiveDeref(dd, b0);
            Cudd_RecursiveDeref(dd, bd);
            return(NULL);
        }
        T = Cudd_NotCond(T, T != NULL);
        Cudd_Ref(T);
        Cudd_RecursiveDeref(dd, b1);
        E = cuddBddAndRecur(dd, Cudd_Not(b0), Cudd_Not(bd));
        if (!E) {
            Cudd_RecursiveDeref(dd, b0);
            Cudd_RecursiveDeref(dd, bd);
            Cudd_RecursiveDeref(dd, T);
            return(NULL);
        }
        E = Cudd_NotCond(E, E != NULL);
        Cudd_Ref(E);
        Cudd_RecursiveDeref(dd, b0);
        Cudd_RecursiveDeref(dd, bd);
    }
    else {
        Cudd_RecursiveDerefZdd(dd, fd);
        T = b1;
        E = b0;
    }

    if (Cudd_IsComplement(T)) {
        neW = cuddUniqueInterIVO(dd, v / 2, Cudd_Not(T), Cudd_Not(E));
        if (!neW) {
            Cudd_RecursiveDeref(dd, T);
            Cudd_RecursiveDeref(dd, E);
            return(NULL);
        }
        neW = Cudd_Not(neW);
    }
    else {
        neW = cuddUniqueInterIVO(dd, v / 2, T, E);
        if (!neW) {
            Cudd_RecursiveDeref(dd, T);
            Cudd_RecursiveDeref(dd, E);
            return(NULL);
        }
    }
    Cudd_Ref(neW);
    Cudd_RecursiveDeref(dd, T);
    Cudd_RecursiveDeref(dd, E);

    cuddCacheInsert1(dd, cuddMakeBddFromZddCover, node, neW);
    Cudd_Deref(neW);
    return(neW);

}